

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O1

h__Reader * __thiscall
AS_02::ACES::MXFReader::h__Reader::FillAncillaryResourceDescriptor
          (h__Reader *this,ResourceList_t *ancillary_resources)

{
  _List_node_base *p_Var1;
  char cVar2;
  undefined8 uVar3;
  ILogSink *this_00;
  _List_node_base *p_Var4;
  InterchangeObject *tmp_iobj;
  AncillaryResourceDescriptor TmpResource;
  Result_t result;
  Result_t local_100 [104];
  int local_98 [26];
  
  p_Var1 = ancillary_resources[0x37].
           super__List_base<AS_02::ACES::AncillaryResourceDescriptor,_std::allocator<AS_02::ACES::AncillaryResourceDescriptor>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  if (p_Var1 == (_List_node_base *)0x0) {
    __assert_fail("m_EssenceDescriptor",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_ACES.cpp"
                  ,0x1ac,
                  "AS_02::Result_t AS_02::ACES::MXFReader::h__Reader::FillAncillaryResourceDescriptor(AS_02::ACES::ResourceList_t &)"
                 );
  }
  p_Var4 = p_Var1[0xc]._M_prev;
  Kumu::Result_t::Result_t((Result_t *)local_98,(Result_t *)Kumu::RESULT_OK);
  if ((p_Var4 != p_Var1[0xd]._M_next) && (-1 < local_98[0])) {
    do {
      ASDCP::MXF::OP1aHeader::GetMDObjectByID
                ((UUID *)local_100,(InterchangeObject **)(ancillary_resources + 1));
      Kumu::Result_t::operator=((Result_t *)local_98,local_100);
      Kumu::Result_t::~Result_t(local_100);
      uVar3 = ASDCP::Dictionary::Type
                        ((MDD_t)(ancillary_resources->
                                super__List_base<AS_02::ACES::AncillaryResourceDescriptor,_std::allocator<AS_02::ACES::AncillaryResourceDescriptor>_>
                                )._M_impl._M_node.super__List_node_base._M_prev);
      cVar2 = (**(code **)(lRam0000000000000000 + 0x78))(0,uVar3);
      if (cVar2 != '\0') {
        this_00 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(this_00,"Broken sub-descriptor link\n");
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
        goto LAB_00151ef7;
      }
      p_Var4 = p_Var4 + 2;
    } while ((p_Var4 != p_Var1[0xd]._M_next) && (-1 < local_98[0]));
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_98);
LAB_00151ef7:
  Kumu::Result_t::~Result_t((Result_t *)local_98);
  return this;
}

Assistant:

AS_02::Result_t AS_02::ACES::MXFReader::h__Reader::FillAncillaryResourceDescriptor(AS_02::ACES::ResourceList_t &ancillary_resources)
{

  assert(m_EssenceDescriptor);
  ASDCP::MXF::RGBAEssenceDescriptor* TDescObj = (ASDCP::MXF::RGBAEssenceDescriptor*)m_EssenceDescriptor;

  Array<Kumu::UUID>::const_iterator sdi = TDescObj->SubDescriptors.begin();
  TargetFrameSubDescriptor* DescObject = NULL;
  Result_t result = RESULT_OK;

  for(; sdi != TDescObj->SubDescriptors.end() && KM_SUCCESS(result); sdi++)
  {
    InterchangeObject* tmp_iobj = NULL;
    result = m_HeaderPart.GetMDObjectByID(*sdi, &tmp_iobj);
    if (!tmp_iobj->IsA(m_Dict->ul(MDD_TargetFrameSubDescriptor)))
        continue;
    DescObject = static_cast<TargetFrameSubDescriptor*>(tmp_iobj);
    if(KM_SUCCESS(result) && DescObject)
    {
      AncillaryResourceDescriptor TmpResource; 
      memcpy(TmpResource.ResourceID, DescObject->TargetFrameAncillaryResourceID.Value(), UUIDlen);
      
      if(DescObject->MediaType.find("image/png") != std::string::npos)
      {
        TmpResource.Type = AS_02::ACES::MT_PNG;
      }
      else if(DescObject->MediaType.find("image/tiff") != std::string::npos)
      {
        TmpResource.Type = AS_02::ACES::MT_TIFF;
      }
      else
      {
        TmpResource.Type = AS_02::ACES::MT_UNDEF;
      }

      ancillary_resources.push_back(TmpResource);
      m_ResourceMap.insert(ResourceMap_t::value_type(DescObject->TargetFrameAncillaryResourceID, *sdi));
    }
    else
    {
      DefaultLogSink().Error("Broken sub-descriptor link\n");
      return RESULT_FORMAT;
    }
  }

  return result;
}